

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_reopen_with_iterator(void)

{
  uint64_t *puVar1;
  short *psVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint64_t extraout_RAX;
  uint64_t uVar10;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  code *__s;
  void *pvVar15;
  fdb_kvs_handle **ppfVar16;
  fdb_kvs_handle *pfVar17;
  char *pcVar18;
  char cVar19;
  char *unaff_RBP;
  fdb_kvs_handle *pfVar20;
  char *pcVar21;
  fdb_file_info *info_00;
  fdb_file_handle *pfVar22;
  fdb_iterator *pfVar23;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle_00 [8];
  uint uVar24;
  void *unaff_R12;
  bool *pbVar25;
  size_t unaff_R13;
  btree *pbVar26;
  fdb_config *pfVar27;
  ulong uVar28;
  size_t sVar29;
  btree *ptr_fhandle_00;
  fdb_doc **ppfVar30;
  __atomic_base<unsigned_long> _Var31;
  timeval tVar32;
  timeval tVar33;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_file_handle *compact_file;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_17590;
  undefined1 auStack_17588 [16];
  undefined1 auStack_17578 [8];
  undefined1 auStack_17570 [80];
  ulong uStack_17520;
  timeval tStack_17500;
  fdb_file_info afStack_174f0 [3];
  fdb_file_info afStack_173f0 [3];
  fdb_config fStack_172f0;
  fdb_kvs_handle *pfStack_171f8;
  fdb_kvs_handle *pfStack_171f0;
  fdb_kvs_handle *pfStack_171e8;
  fdb_config *pfStack_171e0;
  fdb_doc **ppfStack_171d8;
  fdb_kvs_handle *pfStack_171d0;
  fdb_file_handle *pfStack_171c0;
  fdb_kvs_handle *pfStack_171b8;
  timeval atStack_171b0 [2];
  timeval tStack_17190;
  timeval tStack_17180;
  undefined1 auStack_17170 [70];
  undefined1 uStack_1712a;
  undefined8 uStack_17120;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17060;
  fdb_kvs_handle *pfStack_17058;
  fdb_kvs_handle *pfStack_17050;
  fdb_kvs_handle *pfStack_17048;
  fdb_doc **ppfStack_17040;
  fdb_kvs_handle *pfStack_17038;
  undefined1 auStack_17020 [16];
  fdb_kvs_handle *pfStack_17010;
  fdb_kvs_handle *pfStack_17008;
  fdb_kvs_handle *pfStack_17000;
  fdb_kvs_handle *pfStack_16ff8;
  fdb_kvs_handle *pfStack_16ff0;
  fdb_kvs_config fStack_16fe8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16fd0;
  filemgr *pfStack_16fc8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16fc0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16fb8;
  filemgr *pfStack_16fb0;
  fdb_kvs_handle *pfStack_16fa8;
  timeval tStack_16fa0;
  undefined1 auStack_16f90 [256];
  __atomic_base<unsigned_long> _Stack_16e90;
  timeval tStack_16e88;
  __atomic_base<unsigned_long> _Stack_16e78;
  fdb_doc *apfStack_16e30 [32];
  char acStack_16d30 [256];
  char acStack_16c30 [256];
  fdb_kvs_handle afStack_16b30 [153];
  char acStack_32b0 [8];
  fdb_kvs_handle *pfStack_32a8;
  fdb_kvs_handle *pfStack_32a0;
  fdb_kvs_handle *pfStack_3298;
  fdb_kvs_handle *pfStack_3290;
  fdb_doc **ppfStack_3288;
  fdb_kvs_handle *pfStack_3280;
  fdb_kvs_handle *pfStack_3268;
  fdb_kvs_handle *pfStack_3260;
  fdb_doc *pfStack_3258;
  void *pvStack_3250;
  fdb_kvs_config fStack_3248;
  undefined1 auStack_3230 [48];
  timeval tStack_3200;
  undefined1 auStack_31f0 [760];
  char acStack_2ef8 [256];
  fdb_doc *apfStack_2df8 [101];
  fdb_kvs_handle **ppfStack_2ad0;
  fdb_kvs_handle *pfStack_2ac8;
  fdb_kvs_handle *pfStack_2ac0;
  fdb_kvs_info *pfStack_2ab8;
  fdb_doc **ppfStack_2ab0;
  fdb_kvs_handle *pfStack_2aa8;
  undefined1 auStack_2a90 [16];
  undefined1 auStack_2a80 [24];
  undefined1 auStack_2a68 [32];
  fdb_kvs_handle *apfStack_2a48 [5];
  timeval tStack_2a20;
  char acStack_2a10 [256];
  fdb_doc *apfStack_2910 [31];
  fdb_config fStack_2818;
  undefined1 auStack_2720 [752];
  undefined8 auStack_2430 [31];
  fdb_kvs_handle **ppfStack_2338;
  fdb_kvs_handle *pfStack_2330;
  fdb_kvs_handle *pfStack_2328;
  fdb_kvs_config *pfStack_2320;
  fdb_doc **ppfStack_2318;
  fdb_kvs_handle *pfStack_2310;
  fdb_kvs_handle *pfStack_22f8;
  fdb_kvs_handle *pfStack_22f0;
  fdb_doc *pfStack_22e8;
  fdb_kvs_handle *pfStack_22e0;
  fdb_doc *apfStack_22d8 [11];
  timeval tStack_2280;
  fdb_kvs_config fStack_2270;
  char acStack_2258 [256];
  undefined1 auStack_2158 [656];
  fdb_config fStack_1ec8;
  fdb_kvs_handle **ppfStack_1dd0;
  fdb_kvs_handle *pfStack_1dc8;
  fdb_kvs_handle *pfStack_1dc0;
  btree *pbStack_1db8;
  btree *pbStack_1db0;
  fdb_kvs_handle *pfStack_1da8;
  fdb_kvs_handle *pfStack_1d98;
  fdb_kvs_handle *pfStack_1d90;
  fdb_file_handle *pfStack_1d88;
  fdb_kvs_handle *pfStack_1d80;
  undefined1 auStack_1d78 [40];
  undefined1 auStack_1d50 [40];
  fdb_file_info fStack_1d28;
  undefined1 auStack_1ce0 [768];
  char acStack_19e0 [264];
  code *pcStack_18d8;
  fdb_kvs_handle *pfStack_18d0;
  fdb_kvs_handle *pfStack_18c8;
  char *pcStack_18c0;
  long lStack_18b8;
  fdb_kvs_handle *pfStack_18b0;
  fdb_snapshot_info_t *pfStack_1898;
  fdb_file_handle *pfStack_1890;
  char *pcStack_1888;
  int iStack_187c;
  undefined1 auStack_1878 [96];
  undefined1 auStack_1818 [32];
  timeval tStack_17f8;
  fdb_kvs_handle fStack_17e8;
  char acStack_1548 [256];
  fdb_config fStack_1448;
  size_t sStack_1350;
  size_t sStack_1348;
  fdb_doc **ppfStack_1340;
  char *pcStack_1338;
  code *pcStack_1330;
  code *pcStack_1328;
  fdb_file_handle *pfStack_1310;
  fdb_snapshot_info_t *pfStack_1308;
  uint64_t uStack_1300;
  uint uStack_12f4;
  fdb_kvs_handle *apfStack_12f0 [4];
  fdb_kvs_config fStack_12d0;
  char acStack_12b8 [8];
  timeval tStack_12b0;
  char acStack_12a0 [256];
  char acStack_11a0 [256];
  char acStack_10a0 [264];
  fdb_config fStack_f98;
  fdb_doc *apfStack_ea0 [301];
  fdb_kvs_handle **ppfStack_538;
  void *pvStack_530;
  size_t sStack_528;
  fdb_kvs_handle *pfStack_520;
  btree *pbStack_518;
  code *pcStack_510;
  fdb_kvs_handle *local_4f8;
  fdb_iterator *local_4f0;
  fdb_kvs_handle *local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [40];
  btree bStack_4a8;
  fdb_kvs_info local_460;
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  pcStack_510 = (code *)0x10d8b6;
  gettimeofday((timeval *)(local_4d0 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_510 = (code *)0x10d8bb;
  memleak_start();
  local_4e8 = (fdb_kvs_handle *)0x0;
  pcStack_510 = (code *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_510 = (code *)0x10d8e0;
  fdb_get_default_config();
  pfVar5 = (fdb_kvs_handle *)local_4d0;
  pcStack_510 = (code *)0x10d8ed;
  fdb_get_default_kvs_config();
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  pbVar26 = (btree *)local_4e0;
  pcStack_510 = (code *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",&local_430);
  ppfVar16 = &local_4f8;
  pcStack_510 = (code *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)local_4e0._0_8_,ppfVar16,"db",(fdb_kvs_config *)pfVar5);
  pcStack_510 = (code *)0x10d947;
  pfVar11 = local_4f8;
  fVar3 = fdb_set_log_callback(local_4f8,logCallbackFunc,"compact_reopen_with_iterator");
  uVar24 = (uint)pfVar11;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (void *)0x0;
    uVar12 = 0;
    do {
      pcStack_510 = (code *)0x10d96f;
      sprintf(local_138,"key%d",uVar12 & 0xffffffff);
      pcStack_510 = (code *)0x10d987;
      sprintf(local_238,"meta%d",uVar12 & 0xffffffff);
      pcStack_510 = (code *)0x10d99f;
      sprintf(local_338,"body%d",uVar12 & 0xffffffff);
      pbVar26 = (btree *)(&bStack_4a8.ksize + (long)unaff_R12);
      pcStack_510 = (code *)0x10d9af;
      unaff_R13 = strlen(local_138);
      unaff_RBP = local_238;
      pcStack_510 = (code *)0x10d9c2;
      pfVar5 = (fdb_kvs_handle *)strlen(unaff_RBP);
      pcStack_510 = (code *)0x10d9d2;
      sVar6 = strlen(local_338);
      pcStack_510 = (code *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar26,local_138,unaff_R13,unaff_RBP,(size_t)pfVar5,local_338,
                     sVar6);
      pcStack_510 = (code *)0x10da06;
      fdb_set(local_4f8,*(fdb_doc **)(&bStack_4a8.ksize + uVar12 * 8));
      uVar12 = uVar12 + 1;
      unaff_R12 = (void *)((long)unaff_R12 + 8);
    } while (uVar12 != 9);
    pcStack_510 = (code *)0x10da23;
    fdb_commit((fdb_file_handle *)local_4e0._0_8_,'\0');
    ppfVar16 = (fdb_kvs_handle **)(local_4e0 + 8);
    pcStack_510 = (code *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar16,"./compact_test1",&local_430);
    pcStack_510 = (code *)0x10da4e;
    pfVar22 = (fdb_file_handle *)local_4e0._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)local_4e0._8_8_,"./compact_test2");
    uVar24 = (uint)pfVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pcStack_510 = (code *)0x10da60;
    fdb_close((fdb_file_handle *)local_4e0._8_8_);
    pcStack_510 = (code *)0x10da80;
    pfVar11 = local_4f8;
    fVar3 = fdb_iterator_init(local_4f8,&local_4f0,(void *)0x0,0,(void *)0x0,0,0);
    uVar24 = (uint)pfVar11;
    pfVar11 = pfVar5;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    unaff_R13 = 0;
    ppfVar16 = &local_4e8;
    do {
      pcStack_510 = (code *)0x10da9d;
      fVar3 = fdb_iterator_get(local_4f0,(fdb_doc **)ppfVar16);
      pfVar11 = local_4e8;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pcStack_510 = (code *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pcStack_510 = (code *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pcStack_510 = (code *)0x10dc6c;
        pvVar15 = unaff_R12;
        compact_reopen_with_iterator();
        uVar24 = (uint)pvVar15;
        goto LAB_0010dc6c;
      }
      pbVar26 = (btree *)local_4e8->op_stats;
      unaff_RBP = *(char **)(&bStack_4a8.ksize + unaff_R13 * 8);
      unaff_R12 = *(void **)(unaff_RBP + 0x20);
      pcStack_510 = (code *)0x10dac5;
      iVar4 = bcmp(pbVar26,unaff_R12,*(size_t *)&local_4e8->kvs_config);
      pfVar5 = pfVar11;
      if (iVar4 != 0) {
        pcStack_510 = (code *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar26 = pfVar11->staletree;
      unaff_R12 = *(void **)(unaff_RBP + 0x38);
      pcStack_510 = (code *)0x10dae4;
      iVar4 = bcmp(pbVar26,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
      if (iVar4 != 0) goto LAB_0010dc61;
      pbVar26 = (pfVar11->field_6).seqtree;
      unaff_R12 = *(void **)(unaff_RBP + 0x40);
      pcStack_510 = (code *)0x10db03;
      iVar4 = bcmp(pbVar26,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_0010dc56;
      pcStack_510 = (code *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar11);
      local_4e8 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pcStack_510 = (code *)0x10db29;
      pfVar23 = local_4f0;
      fVar3 = fdb_iterator_next(local_4f0);
      uVar24 = (uint)pfVar23;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dc7b;
    pcStack_510 = (code *)0x10db46;
    fVar3 = fdb_iterator_close(local_4f0);
    uVar24 = (uint)local_4f0;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pcStack_510 = (code *)0x10db66;
      fdb_get_kvs_info(local_4f8,&local_460);
      lVar13 = (long)(int)local_460.doc_count;
      pcStack_510 = (code *)0x10db72;
      fdb_kvs_close(local_4f8);
      pcStack_510 = (code *)0x10db80;
      fdb_close((fdb_file_handle *)local_4e0._0_8_);
      pcStack_510 = (code *)0x10db97;
      fdb_open((fdb_file_handle **)local_4e0,"./compact_test2",&local_430);
      pcStack_510 = (code *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)local_4e0._0_8_,&local_4f8,"db",(fdb_kvs_config *)local_4d0);
      pcStack_510 = (code *)0x10dbba;
      fdb_get_kvs_info(local_4f8,&local_460);
      if (lVar13 != CONCAT44(local_460.doc_count._4_4_,(int)local_460.doc_count)) {
        pcStack_510 = (code *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pcStack_510 = (code *)0x10dbda;
      fdb_kvs_close(local_4f8);
      pcStack_510 = (code *)0x10dbe4;
      fdb_close((fdb_file_handle *)local_4e0._0_8_);
      lVar13 = 0;
      do {
        pcStack_510 = (code *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_4a8.ksize + lVar13 * 8));
        lVar13 = lVar13 + 1;
      } while (lVar13 != 9);
      pcStack_510 = (code *)0x10dbfe;
      fdb_shutdown();
      pcStack_510 = (code *)0x10dc03;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_510 = (code *)0x10dc34;
      fprintf(_stderr,pcVar21,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dc6c:
    pcStack_510 = (code *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pcStack_510 = (code *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar11 = pfVar5;
LAB_0010dc76:
    pcStack_510 = (code *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pcStack_510 = (code *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pcStack_510 = estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_1328 = (code *)0x10dca7;
  ppfStack_538 = ppfVar16;
  pvStack_530 = unaff_R12;
  sStack_528 = unaff_R13;
  pfStack_520 = pfVar11;
  pbStack_518 = pbVar26;
  pcStack_510 = (code *)unaff_RBP;
  gettimeofday(&tStack_12b0,(__timezone_ptr_t)0x0);
  pcStack_1328 = (code *)0x10dcac;
  memleak_start();
  pcStack_1328 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_1328 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_f98.buffercache_size = 0;
  fStack_f98.wal_threshold = 0x32;
  fStack_f98.flags = 1;
  fStack_f98.compaction_threshold = '\0';
  fStack_f98.block_reusing_threshold = 0;
  pcStack_1328 = (code *)0x10dcf4;
  fStack_f98.multi_kv_instances = (bool)(char)uVar24;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_1328 = (code *)0x10dd08;
  fdb_open(&pfStack_1310,"./compact_test1",&fStack_f98);
  uStack_12f4 = uVar24;
  if (uVar24 == 0) {
    pcStack_1328 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_1310,apfStack_12f0,&fStack_12d0);
    sVar14 = 1;
  }
  else {
    ppfVar16 = apfStack_12f0;
    uVar12 = 0;
    do {
      pcStack_1328 = (code *)0x10dd39;
      sprintf(acStack_12b8,"kv%d",uVar12 & 0xffffffff);
      pcStack_1328 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_1310,ppfVar16,acStack_12b8,&fStack_12d0);
      uVar12 = uVar12 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar12 != 4);
    sVar14 = 4;
  }
  uVar12 = 0;
  do {
    pcStack_1328 = (code *)0x10dd98;
    sprintf(acStack_10a0,"key%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10ddb1;
    sprintf(acStack_11a0,"meta%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10ddca;
    sprintf(acStack_12a0,"body%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10dddd;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10ddf0;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10de00;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10de25;
    fdb_doc_create(apfStack_ea0 + uVar12,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10de36;
      fdb_set(apfStack_12f0[sVar29],apfStack_ea0[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x4b);
  pcStack_1328 = (code *)0x10de5a;
  fdb_commit(pfStack_1310,'\x01');
  uVar12 = 0x4b;
  do {
    pcStack_1328 = (code *)0x10de7c;
    sprintf(acStack_10a0,"key%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10de95;
    sprintf(acStack_11a0,"meta%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10deae;
    sprintf(acStack_12a0,"body%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10dec1;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10ded4;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10dee4;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10df09;
    fdb_doc_create(apfStack_ea0 + uVar12,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10df1a;
      fdb_set(apfStack_12f0[sVar29],apfStack_ea0[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x96);
  lVar13 = 0;
  do {
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10df4a;
      fdb_set(apfStack_12f0[sVar29],apfStack_ea0[lVar13]);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x4b);
  lVar13 = 0;
  do {
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10df73;
      fdb_set(apfStack_12f0[sVar29],apfStack_ea0[lVar13]);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x4b);
  pcStack_1328 = (code *)0x10df90;
  fdb_commit(pfStack_1310,'\0');
  uVar12 = 0x96;
  do {
    pcStack_1328 = (code *)0x10dfb2;
    sprintf(acStack_10a0,"key%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10dfcb;
    sprintf(acStack_11a0,"meta%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10dfe4;
    sprintf(acStack_12a0,"body%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10dff7;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10e00a;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10e01a;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10e03f;
    fdb_doc_create(apfStack_ea0 + uVar12,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10e050;
      fdb_set(apfStack_12f0[sVar29],apfStack_ea0[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xe1);
  pcStack_1328 = (code *)0x10e077;
  fdb_commit(pfStack_1310,'\x01');
  uVar12 = 0xe1;
  do {
    pcStack_1328 = (code *)0x10e099;
    sprintf(acStack_10a0,"key%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10e0b2;
    sprintf(acStack_11a0,"meta%d",uVar12 & 0xffffffff);
    pcStack_1328 = (code *)0x10e0cb;
    sprintf(acStack_12a0,"body%d",uVar12 & 0xffffffff);
    ppfVar30 = apfStack_ea0 + uVar12;
    pcStack_1328 = (code *)0x10e0de;
    sVar6 = strlen(acStack_10a0);
    pcStack_1328 = (code *)0x10e0f1;
    sVar7 = strlen(acStack_11a0);
    pcStack_1328 = (code *)0x10e101;
    sVar8 = strlen(acStack_12a0);
    pcStack_1328 = (code *)0x10e126;
    fdb_doc_create(ppfVar30,acStack_10a0,sVar6,acStack_11a0,sVar7,acStack_12a0,sVar8);
    sVar29 = 0;
    do {
      pcStack_1328 = (code *)0x10e137;
      fdb_set(apfStack_12f0[sVar29],*ppfVar30);
      sVar29 = sVar29 + 1;
    } while (sVar14 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 300);
  sVar29 = 0;
  pcStack_1328 = (code *)0x10e15e;
  fdb_commit(pfStack_1310,'\0');
  do {
    pfVar5 = apfStack_12f0[sVar29];
    pcStack_1328 = (code *)0x10e17c;
    fVar3 = fdb_set_log_callback(pfVar5,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar5;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_1328 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar29 = sVar29 + 1;
  } while (sVar14 != sVar29);
  pcStack_1328 = (code *)0x10e1a0;
  pfVar22 = pfStack_1310;
  fVar3 = fdb_get_all_snap_markers(pfStack_1310,&pfStack_1308,&uStack_1300);
  iVar4 = (int)pfVar22;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar6 = (size_t)uStack_12f4;
    cVar19 = (char)uStack_12f4;
    uVar10 = uStack_1300;
    if (cVar19 != '\0') {
      if (uStack_1300 != 8) {
        pcStack_1328 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_1328 = (code *)0x10e1d9;
      sVar14 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[1].marker);
      pcStack_1328 = (code *)0x10e1ef;
      sVar9 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[2].marker);
      if (sVar9 <= sVar14) {
        pcStack_1328 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar10 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_1328 = (code *)0x10e24a;
      fVar3 = fdb_free_snap_markers(pfStack_1308,uStack_1300);
      iVar4 = (int)pfStack_1308;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_1328 = (code *)0x10e25c;
        fdb_close(pfStack_1310);
        lVar13 = 0;
        do {
          pcStack_1328 = (code *)0x10e26b;
          fdb_doc_free(apfStack_ea0[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 300);
        pcStack_1328 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_1328 = (code *)0x10e281;
        memleak_end();
        pcVar21 = "single kv mode:";
        if (cVar19 != '\0') {
          pcVar21 = "multiple kv mode:";
        }
        pcStack_1328 = (code *)0x10e2af;
        sprintf(acStack_12a0,"estimate space upto marker in file test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStack_1328 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar21,acStack_12a0);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar10 != 4) {
      pcStack_1328 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_1328 = (code *)0x10e21c;
    sVar14 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[1].marker);
    pcStack_1328 = (code *)0x10e232;
    pfVar22 = pfStack_1310;
    sVar9 = fdb_estimate_space_used_from(pfStack_1310,pfStack_1308[2].marker);
    iVar4 = (int)pfVar22;
    if (sVar14 < sVar9) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_1328 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_1328 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_1328 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_1330 = logCallbackFunc;
  pcStack_1338 = "estimate_space_upto_test";
  pfStack_18b0 = (fdb_kvs_handle *)0x10e327;
  sStack_1350 = sVar14;
  sStack_1348 = sVar29;
  ppfStack_1340 = ppfVar30;
  pcStack_1328 = (code *)sVar6;
  gettimeofday(&tStack_17f8,(__timezone_ptr_t)0x0);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_18b0 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_18b0 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_1448.buffercache_size = 0;
  fStack_1448.wal_threshold = 0x400;
  fStack_1448.flags = 1;
  fStack_1448.compaction_threshold = '\0';
  fStack_1448.block_reusing_threshold = 0;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e374;
  fStack_1448.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18b0 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_1890,"./compact_test1",&fStack_1448);
  iStack_187c = iVar4;
  if (iVar4 == 0) {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_1890,(fdb_kvs_handle **)(auStack_1878 + 0x20),
               (fdb_kvs_config *)(auStack_1878 + 0x48));
    uVar24 = 1;
  }
  else {
    ppfVar16 = (fdb_kvs_handle **)(auStack_1878 + 0x20);
    uVar12 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_1878,"kv%d",uVar12 & 0xffffffff);
      pfStack_18b0 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_1890,ppfVar16,auStack_1878,(fdb_kvs_config *)(auStack_1878 + 0x48));
      uVar12 = uVar12 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar12 != 4);
    uVar24 = 4;
  }
  pfVar5 = (fdb_kvs_handle *)(ulong)uVar24;
  uVar12 = 0;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_17e8.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_17e8.config.compaction_minimum_filesize,"meta%d",uVar12 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_1548,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_17e8.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e45f;
    sVar6 = strlen((char *)&fStack_17e8.kv_info_offset);
    puVar1 = &fStack_17e8.config.compaction_minimum_filesize;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e472;
    sVar7 = strlen((char *)puVar1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e482;
    sVar8 = strlen(acStack_1548);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_17e8.kv_info_offset,sVar6,puVar1,sVar7,acStack_1548,
                   sVar8);
    lVar13 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar13 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar13 = lVar13 + 1;
    } while (pfVar5 != (fdb_kvs_handle *)lVar13);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_1890,'\x01');
  uVar12 = 5;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_17e8.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_17e8.config.compaction_minimum_filesize;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_1548,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_17e8.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e549;
    sVar6 = strlen((char *)&fStack_17e8.kv_info_offset);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e554;
    sVar7 = strlen((char *)puVar1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e55f;
    sVar8 = strlen(acStack_1548);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_17e8.kv_info_offset,sVar6,
                   &fStack_17e8.config.compaction_minimum_filesize,sVar7,acStack_1548,sVar8);
    lVar13 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar13 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar13 = lVar13 + 1;
    } while (pfVar5 != (fdb_kvs_handle *)lVar13);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 10);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_1890,'\0');
  uVar12 = 10;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_17e8.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_17e8.config.compaction_minimum_filesize;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_1548,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_17e8.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e622;
    sVar6 = strlen((char *)&fStack_17e8.kv_info_offset);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e62d;
    sVar7 = strlen((char *)puVar1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e638;
    sVar8 = strlen(acStack_1548);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_17e8.kv_info_offset,sVar6,
                   &fStack_17e8.config.compaction_minimum_filesize,sVar7,acStack_1548,sVar8);
    lVar13 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar13 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar13 = lVar13 + 1;
    } while (pfVar5 != (fdb_kvs_handle *)lVar13);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xf);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_1890,'\x01');
  uVar12 = 0xf;
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_17e8.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_17e8.config.compaction_minimum_filesize;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_1548,"body%d",uVar12 & 0xffffffff);
    pfVar11 = (fdb_kvs_handle *)(&fStack_17e8.kvs_config.create_if_missing + uVar12 * 8);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e6fe;
    sVar6 = strlen((char *)&fStack_17e8.kv_info_offset);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e709;
    handle = (fdb_kvs_handle *)strlen((char *)puVar1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e714;
    sVar7 = strlen(acStack_1548);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar11,&fStack_17e8.kv_info_offset,sVar6,
                   &fStack_17e8.config.compaction_minimum_filesize,(size_t)handle,acStack_1548,sVar7
                  );
    lVar13 = 0;
    do {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_1878 + lVar13 * 8 + 0x20),
              *(fdb_doc **)&pfVar11->kvs_config);
      lVar13 = lVar13 + 1;
    } while (pfVar5 != (fdb_kvs_handle *)lVar13);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x14);
  lVar13 = 0;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_1890,'\0');
  __s = logCallbackFunc;
  pcVar21 = "compact_upto_test";
  do {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e78b;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1878 + lVar13 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar13 = lVar13 + 1;
  } while (pfVar5 != (fdb_kvs_handle *)lVar13);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e7af;
  fVar3 = fdb_get_all_snap_markers(pfStack_1890,&pfStack_1898,(uint64_t *)&pcStack_1888);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010ead4;
  if ((char)iStack_187c == '\0') {
    if (pcStack_1888 != (char *)0x4) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e8c9;
      compact_upto_test();
    }
    if (pcStack_1888 != (char *)0x0) {
      lVar13 = 0x1400000000;
      handle = (fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar21 = (char *)0x0;
      do {
        if (*(long *)((long)&pfStack_1898->num_kvs_markers + (long)handle) != 1) {
          pfStack_18b0 = (fdb_kvs_handle *)0x10eab6;
          compact_upto_test();
        }
        if (*(long *)(*(long *)((long)&pfStack_1898->kvs_markers + (long)handle) + 8) !=
            lVar13 >> 0x20) {
          pfStack_18b0 = (fdb_kvs_handle *)0x10eac3;
          compact_upto_test();
        }
        pcVar21 = pcVar21 + 1;
        lVar13 = lVar13 + -0x500000000;
        handle = (fdb_kvs_handle *)((long)handle + 0x18);
      } while (pcVar21 < pcStack_1888);
    }
    __s = (code *)auStack_1818;
    pfStack_18b0 = (fdb_kvs_handle *)0x10e8f3;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_18b0 = (fdb_kvs_handle *)0x10e909;
    fVar3 = fdb_compact_upto(pfStack_1890,(char *)__s,pfStack_1898[1].marker);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e92d;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1878._32_8_,
                                (fdb_kvs_handle **)(auStack_1878 + 0x18),
                                (pfStack_1898[1].kvs_markers)->seqnum);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e936;
        compact_upto_test();
        goto LAB_0010e936;
      }
LAB_0010e996:
      __s = (code *)auStack_1818;
      pfStack_18b0 = (fdb_kvs_handle *)0x10e9a0;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1878._24_8_);
      pfStack_18b0 = (fdb_kvs_handle *)0x10e9af;
      fVar3 = fdb_free_snap_markers(pfStack_1898,(uint64_t)pcStack_1888);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e9c1;
        fdb_close(pfStack_1890);
        lVar13 = 0;
        do {
          pfStack_18b0 = (fdb_kvs_handle *)0x10e9d0;
          fdb_doc_free(*(fdb_doc **)(&fStack_17e8.kvs_config.create_if_missing + lVar13 * 8));
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x14);
        pfStack_18b0 = (fdb_kvs_handle *)0x10e9de;
        fdb_shutdown();
        pfStack_18b0 = (fdb_kvs_handle *)0x10e9e3;
        memleak_end();
        pcVar21 = "single kv mode:";
        if ((char)iStack_187c != '\0') {
          pcVar21 = "multiple kv mode:";
        }
        pfStack_18b0 = (fdb_kvs_handle *)0x10ea13;
        sprintf(acStack_1548,"compact upto marker in file test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_18b0 = (fdb_kvs_handle *)0x10ea40;
        fprintf(_stderr,pcVar21,acStack_1548);
        return;
      }
      goto LAB_0010ead9;
    }
    goto LAB_0010eade;
  }
  if (pcStack_1888 != (char *)0x8) {
    pfStack_18b0 = (fdb_kvs_handle *)0x10e7d7;
    compact_upto_test();
  }
  auStack_1878._8_8_ = ZEXT48(uVar24 + 1);
  handle = (fdb_kvs_handle *)auStack_1878;
  pvVar15 = (void *)0x0;
  do {
    pcVar21 = (char *)((long)pvVar15 * 3);
    if ((fdb_custom_cmp_variable)pfStack_1898[(long)pvVar15].num_kvs_markers !=
        (fdb_custom_cmp_variable)auStack_1878._8_8_) {
      pfStack_18b0 = (fdb_kvs_handle *)0x10e8b4;
      compact_upto_test();
    }
    __s = (code *)((long)pvVar15 * -5 + 0x14);
    lVar13 = 8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    auStack_1878._16_8_ = pvVar15;
    do {
      if (*(code **)(lVar13 + (long)&(pfStack_1898[(long)pvVar15].kvs_markers)->kv_store_name) !=
          __s) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10e88a;
        compact_upto_test();
      }
      pfStack_18b0 = (fdb_kvs_handle *)0x10e83d;
      sprintf((char *)handle,"kv%d",(ulong)pfVar11 & 0xffffffff);
      psVar2 = *(short **)((long)&pfStack_1898[(long)pvVar15].kvs_markers[-1].seqnum + lVar13);
      if ((char)psVar2[1] != auStack_1878[2] || *psVar2 != auStack_1878._0_2_) {
        pfStack_18b0 = (fdb_kvs_handle *)0x10eacf;
        compact_upto_test();
        goto LAB_0010eacf;
      }
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      lVar13 = lVar13 + 0x10;
    } while (pfVar5 != pfVar11);
    pvVar15 = (void *)(auStack_1878._16_8_ + 1);
  } while ((fdb_kvs_handle *)pvVar15 != pfVar5);
LAB_0010e936:
  __s = (code *)auStack_1818;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e954;
  sprintf((char *)__s,"compact_test_compact%d",1);
  pfStack_18b0 = (fdb_kvs_handle *)0x10e96a;
  fVar3 = fdb_compact_upto(pfStack_1890,(char *)__s,pfStack_1898[1].marker);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
  pfStack_18b0 = (fdb_kvs_handle *)0x10e98e;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1878._40_8_,
                            (fdb_kvs_handle **)(auStack_1878 + 0x18),
                            pfStack_1898[1].kvs_markers[1].seqnum);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
  goto LAB_0010eae8;
LAB_001107eb:
  pfStack_17038 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar5 = pfVar20;
LAB_001107f6:
  pfVar20 = pfVar5;
  pfStack_17038 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_17038 = (fdb_kvs_handle *)0x110806;
  pcVar21 = (char *)handle;
  compaction_daemon_test();
  pfVar5 = pfVar20;
LAB_00110806:
  _Var31._M_i = (__int_type_conflict)apfStack_16e30;
  pcVar18 = "key%04d";
  pfStack_17038 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_0010eacf:
  pfStack_18b0 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
LAB_0010ead4:
  pfStack_18b0 = (fdb_kvs_handle *)0x10ead9;
  compact_upto_test();
LAB_0010ead9:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eade;
  compact_upto_test();
LAB_0010eade:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eae3;
  compact_upto_test();
LAB_0010eae3:
  pfStack_18b0 = (fdb_kvs_handle *)0x10eae8;
  compact_upto_test();
LAB_0010eae8:
  pfStack_18b0 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_18d8 = __s;
  pfStack_18d0 = handle;
  pfStack_18c8 = pfVar11;
  pcStack_18c0 = pcVar21;
  lStack_18b8 = lVar13;
  pfStack_18b0 = pfVar5;
  gettimeofday((timeval *)(auStack_1d50 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar26 = (btree *)auStack_1d50;
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_1ce0[0x110] = '\0';
  auStack_1ce0[0x111] = '\0';
  auStack_1ce0[0x112] = '\0';
  auStack_1ce0[0x113] = '\x01';
  auStack_1ce0[0x114] = '\0';
  auStack_1ce0[0x115] = '\0';
  auStack_1ce0[0x116] = '\0';
  auStack_1ce0[0x117] = '\0';
  auStack_1ce0[0x118] = '\0';
  auStack_1ce0[0x119] = '\x04';
  auStack_1ce0[0x11a] = '\0';
  auStack_1ce0[0x11b] = '\0';
  auStack_1ce0[0x11c] = '\0';
  auStack_1ce0[0x11d] = '\0';
  auStack_1ce0[0x11e] = '\0';
  auStack_1ce0[0x11f] = '\0';
  auStack_1ce0._300_4_ = 1;
  auStack_1ce0[0x137] = 0;
  ptr_fhandle_00 = (btree *)&pfStack_1d88;
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",(fdb_config *)(auStack_1ce0 + 0x108)
          );
  ppfVar16 = &pfStack_1d90;
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_1d88,ppfVar16,(fdb_kvs_config *)pbVar26);
  pfStack_1da8 = (fdb_kvs_handle *)0x10eb93;
  fVar3 = fdb_set_log_callback(pfStack_1d90,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1da8 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_1d78,"./compact_test1",(fdb_config *)(auStack_1ce0 + 0x108)
            );
    ppfVar16 = &pfStack_1d80;
    pfStack_1da8 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1d78._0_8_,ppfVar16,(fdb_kvs_config *)auStack_1d50);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ebe2;
    fVar3 = fdb_set_log_callback(pfStack_1d80,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar13 = 0;
    uVar12 = 0;
    do {
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_19e0,"key%d",uVar12 & 0xffffffff);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_1ce0 + 0x200,"meta%d",uVar12 & 0xffffffff);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_1ce0,"body%d",uVar12 & 0xffffffff);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec4a;
      sVar6 = strlen(acStack_19e0);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec5d;
      sVar7 = strlen(auStack_1ce0 + 0x200);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec6d;
      sVar8 = strlen(auStack_1ce0);
      pfStack_1da8 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_1d78 + lVar13 + 8),acStack_19e0,sVar6,auStack_1ce0 + 0x200
                     ,sVar7,auStack_1ce0,sVar8);
      pfStack_1da8 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_1d90,*(fdb_doc **)(auStack_1d78 + uVar12 * 8 + 8));
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar12 == 1);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_1d98,*(void **)(auStack_1d78._16_8_ + 0x20),
                   *(size_t *)auStack_1d78._16_8_,*(void **)(auStack_1d78._16_8_ + 0x38),
                   *(size_t *)(auStack_1d78._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_1d98->file = true;
    pfStack_1da8 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_1d90,(fdb_doc *)pfStack_1d98);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_1d98);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_1d88,'\x01');
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_1d88,"./compact_test2");
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_19e0,"key%d",2);
    ptr_fhandle_00 = (btree *)(auStack_1ce0 + 0x200);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)ptr_fhandle_00,"meta%d",2);
    handle = (fdb_kvs_handle *)auStack_1ce0;
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)handle,"body%d",2);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed89;
    pfVar11 = (fdb_kvs_handle *)strlen(acStack_19e0);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed94;
    pfVar5 = (fdb_kvs_handle *)strlen((char *)ptr_fhandle_00);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ed9f;
    sVar6 = strlen((char *)handle);
    pfStack_1da8 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_1d78 + 0x18),acStack_19e0,(size_t)pfVar11,ptr_fhandle_00,
                   (size_t)pfVar5,handle,sVar6);
    pfStack_1da8 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_1d90,(fdb_doc *)auStack_1d78._24_8_);
    pfStack_1da8 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_1d88,'\x01');
    pfStack_1da8 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_1d90);
    ppfVar16 = &pfStack_1d80;
    pfStack_1da8 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_1d80);
    pfStack_1da8 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_1d88);
    pbVar26 = (btree *)auStack_1d78;
    pfStack_1da8 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_1d78._0_8_);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_1da8 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",(fdb_config *)(auStack_1ce0 + 0x108));
    pfStack_1da8 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1d78._0_8_,ppfVar16,(fdb_kvs_config *)auStack_1d50);
    pfStack_1da8 = (fdb_kvs_handle *)0x10ee4d;
    fVar3 = fdb_set_log_callback(pfStack_1d80,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)0x0;
      ppfVar16 = &pfStack_1d98;
      while( true ) {
        pfStack_1da8 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar16,
                       (void *)(*(size_t **)(auStack_1d78 + (long)handle * 8 + 8))[4],
                       **(size_t **)(auStack_1d78 + (long)handle * 8 + 8),(void *)0x0,0,(void *)0x0,
                       0);
        pfStack_1da8 = (fdb_kvs_handle *)0x10ee90;
        fVar3 = fdb_get(pfStack_1d80,(fdb_doc *)pfStack_1d98);
        pfVar17 = pfStack_1d98;
        if (handle != (fdb_kvs_handle *)0x1) break;
        pfVar17 = pfVar11;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_1da8 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_1d98);
        handle = (fdb_kvs_handle *)&(handle->kvs_config).field_0x1;
        pfVar11 = pfVar17;
        if (handle == (fdb_kvs_handle *)0x3) {
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_1d78._0_8_,&fStack_1d28);
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef28;
          iVar4 = strcmp("./compact_test2",fStack_1d28.filename);
          if (iVar4 != 0) {
            pfStack_1da8 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_1d80);
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_1d78._0_8_);
          lVar13 = 0;
          do {
            pfStack_1da8 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_1d78 + lVar13 * 8 + 8));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_1da8 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar21,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pbVar26 = pfStack_1d98->staletree;
        pfVar5 = *(fdb_kvs_handle **)(auStack_1d78 + (long)handle * 8 + 8);
        ptr_fhandle_00 = pfVar5->staletree;
        pfStack_1da8 = (fdb_kvs_handle *)0x10eec9;
        iVar4 = bcmp(pbVar26,ptr_fhandle_00,(size_t)(pfStack_1d98->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          pbVar26 = (pfVar17->field_6).seqtree;
          ptr_fhandle_00 = (pfVar5->field_6).seqtree;
          pfStack_1da8 = (fdb_kvs_handle *)0x10eee8;
          iVar4 = bcmp(pbVar26,ptr_fhandle_00,(size_t)(pfVar17->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010eef0;
          pfStack_1da8 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar11 = pfVar17;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar17 = pfVar11;
        pfStack_1da8 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_1da8 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar11 = pfVar17;
LAB_0010efc7:
      pfStack_1da8 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_1da8 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_1da8 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_1da8 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_2310 = (fdb_kvs_handle *)0x10effb;
  ppfStack_1dd0 = ppfVar16;
  pfStack_1dc8 = handle;
  pfStack_1dc0 = pfVar11;
  pbStack_1db8 = pbVar26;
  pbStack_1db0 = ptr_fhandle_00;
  pfStack_1da8 = pfVar5;
  gettimeofday(&tStack_2280,(__timezone_ptr_t)0x0);
  pfStack_2310 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_2310 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2310 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_2270;
  pfStack_2310 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_1ec8.buffercache_size = 0x1000000;
  fStack_1ec8.wal_threshold = 0x400;
  fStack_1ec8.flags = 1;
  fStack_1ec8.compaction_threshold = '\0';
  ppfVar30 = &pfStack_22e8;
  pfStack_2310 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar30,"./compact_test1",&fStack_1ec8);
  ppfVar16 = &pfStack_22f0;
  pfStack_2310 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_22e8,ppfVar16,config);
  pfStack_2310 = (fdb_kvs_handle *)0x10f087;
  fVar3 = fdb_set_log_callback(pfStack_22f0,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_2310 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_2158 + 0x100,"key%d",uVar12 & 0xffffffff);
      pfStack_2310 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_2158,"meta%d",uVar12 & 0xffffffff);
      pfStack_2310 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_2258,"body%d",uVar12 & 0xffffffff);
      ppfVar30 = (fdb_doc **)((long)apfStack_22d8 + (long)handle);
      pfStack_2310 = (fdb_kvs_handle *)0x10f0ef;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2158 + 0x100);
      pfVar5 = (fdb_kvs_handle *)auStack_2158;
      pfStack_2310 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar5);
      pfStack_2310 = (fdb_kvs_handle *)0x10f112;
      sVar6 = strlen(acStack_2258);
      pfStack_2310 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar30,auStack_2158 + 0x100,(size_t)pfVar11,pfVar5,(size_t)config,
                     acStack_2258,sVar6);
      pfStack_2310 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_22f0,apfStack_22d8[uVar12]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 10);
    pfStack_2310 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_22e8,'\x01');
    pfStack_2310 = (fdb_kvs_handle *)0x10f17a;
    fVar3 = fdb_snapshot_open(pfStack_22f0,&pfStack_22e0,10);
    ppfVar16 = (fdb_kvs_handle **)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_2310 = (fdb_kvs_handle *)0x10f193;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_22e8,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_2310 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_22f8,apfStack_22d8[(long)config]->key,
                       apfStack_22d8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2310 = (fdb_kvs_handle *)0x10f1d6;
        fVar3 = fdb_get(pfStack_22f0,(fdb_doc *)pfStack_22f8);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_2310 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_2310 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_22f8);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_2310 = (fdb_kvs_handle *)0x10f205;
      iVar4 = stat("./compact_test1",(stat *)(auStack_2158 + 0x200));
      if (iVar4 == 0) {
        pfStack_2310 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_2310 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_22f8,apfStack_22d8[(long)config]->key,
                       apfStack_22d8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2310 = (fdb_kvs_handle *)0x10f249;
        fVar3 = fdb_get(pfStack_22e0,(fdb_doc *)pfStack_22f8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_2310 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_22f8);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_2310 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_22e8);
          pfStack_2310 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar13 = 0;
          do {
            pfStack_2310 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_22d8[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 10);
          pfStack_2310 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_2310 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar21,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar16 = &pfStack_22f8;
      pfStack_2310 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_2310 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_2310 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_2310 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f309;
  ppfStack_2338 = ppfVar16;
  pfStack_2330 = handle;
  pfStack_2328 = pfVar11;
  pfStack_2320 = config;
  ppfStack_2318 = ppfVar30;
  pfStack_2310 = pfVar5;
  gettimeofday(&tStack_2a20,(__timezone_ptr_t)0x0);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_2a68;
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_2818.buffercache_size = 0x1000000;
  fStack_2818.wal_threshold = 0x400;
  fStack_2818.flags = 1;
  fStack_2818.compaction_threshold = '\0';
  _Var31._M_i = (__int_type_conflict)(auStack_2a80 + 0x10);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var31._M_i,"./compact_test1",&fStack_2818);
  ppfVar16 = (fdb_kvs_handle **)auStack_2a80;
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_2a80._16_8_,ppfVar16,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_2aa8 = (fdb_kvs_handle *)0x10f394;
  pfVar17 = (fdb_kvs_handle *)auStack_2a80._0_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_2a80._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_2720 + 0x100,"key%d",uVar12 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_2720,"meta%d",uVar12 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_2a10,"body%d",uVar12 & 0xffffffff);
      _Var31._M_i = (long)apfStack_2910 + (long)handle;
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f3ff;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2720 + 0x100);
      pfVar5 = (fdb_kvs_handle *)auStack_2720;
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar5);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f422;
      sVar6 = strlen(acStack_2a10);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var31._M_i,auStack_2720 + 0x100,(size_t)pfVar11,pfVar5,
                     (size_t)info,acStack_2a10,sVar6);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_2a80._0_8_,apfStack_2910[uVar12]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 0x1e);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_2a80._16_8_,'\0');
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_2a80 + 8),"./compact_test1.1",&fStack_2818);
    ppfVar16 = (fdb_kvs_handle **)(auStack_2a90 + 8);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._8_8_,ppfVar16,(char *)0x0,
                 (fdb_kvs_config *)auStack_2a68);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f4bf;
    pfVar17 = (fdb_kvs_handle *)auStack_2a90._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a90._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_2720 + 0x100,"k2ey%d",uVar12 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_2720,"m2eta%d",uVar12 & 0xffffffff);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_2a10,"b2ody%d",uVar12 & 0xffffffff);
      _Var31._M_i = (__int_type_conflict)(auStack_2720 + (long)handle + 0x200);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f52a;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2720 + 0x100);
      pfVar5 = (fdb_kvs_handle *)auStack_2720;
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar5);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f54d;
      sVar6 = strlen(acStack_2a10);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var31._M_i,auStack_2720 + 0x100,(size_t)pfVar11,pfVar5,
                     (size_t)info,acStack_2a10,sVar6);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_2a90._8_8_,(fdb_doc *)auStack_2430[uVar12 - 0x1e]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 0x3c);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_2a80._8_8_,'\0');
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2a90._8_8_,(fdb_kvs_info *)(auStack_2a68 + 0x18));
    ppfVar16 = apfStack_2a48;
    if (apfStack_2a48[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2a90._8_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_2a80._8_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5e3;
    pfVar17 = (fdb_kvs_handle *)auStack_2a80._16_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_2a80._16_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_2a80;
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2a80._0_8_);
    _Var31._M_i = (__int_type_conflict)(auStack_2a80 + 0x10);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_2a80._16_8_);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var31._M_i,"./compact_test1",&fStack_2818);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_2a68);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f644;
    pfVar17 = (fdb_kvs_handle *)auStack_2a80._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a80._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    handle = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_2a90;
    do {
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_2910 + (long)handle))[4],
                     **(size_t **)((long)apfStack_2910 + (long)handle),(void *)0x0,0,(void *)0x0,0);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f68a;
      pfVar17 = (fdb_kvs_handle *)auStack_2a80._0_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_2a80._0_8_,(fdb_doc *)auStack_2a90._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var31._M_i = (long)apfStack_2910 + (long)handle;
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f6b6;
      iVar4 = bcmp(*(btree **)(auStack_2a90._0_8_ + 0x38),(*(fdb_doc **)_Var31._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_2a90._0_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f6d3;
      iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2a90._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var31._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_2a90._0_8_)->custom_cmp_param);
      if (iVar4 != 0) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_2a90._0_8_);
      handle = (fdb_kvs_handle *)&(handle->kvs_config).custom_cmp;
    } while (handle != (fdb_kvs_handle *)0xf0);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_2a80 + 8),"./compact_test1.1",&fStack_2818);
    info = (fdb_kvs_info *)(auStack_2a90 + 8);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_2a80._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_2a68);
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f757;
    pfVar17 = (fdb_kvs_handle *)auStack_2a90._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2a90._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_2a68 + 0x18);
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_2a90._8_8_,info);
      if (apfStack_2a48[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var31._M_i = 0;
      ppfVar16 = (fdb_kvs_handle **)auStack_2a90;
      while( true ) {
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar16,
                       (void *)(*(size_t **)(auStack_2720 + 0x200 + _Var31._M_i))[4],
                       **(size_t **)(auStack_2720 + 0x200 + _Var31._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f7be;
        pfVar17 = (fdb_kvs_handle *)auStack_2a90._8_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_2a90._8_8_,(fdb_doc *)auStack_2a90._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_2720 + 0x200 + _Var31._M_i);
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f7ea;
        iVar4 = bcmp(*(btree **)(auStack_2a90._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_2a90._0_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f807;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2a90._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_2a90._0_8_)->custom_cmp_param);
        if (iVar4 != 0) {
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_2aa8 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_2a90._0_8_);
        _Var31._M_i = _Var31._M_i + 8;
        if ((fdb_doc **)_Var31._M_i == (fdb_doc **)0x1e0) {
          lVar13 = 0;
          do {
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_2910[lVar13]);
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_2430[lVar13 + -0x1e]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          lVar13 = 0;
          do {
            pfStack_2aa8 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_2430[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2a80._0_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_2a80._16_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2a90._8_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_2a80._8_8_);
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_2aa8 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar21,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_2aa8 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_2aa8 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_2aa8 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_3280 = (fdb_kvs_handle *)0x10f937;
  ppfStack_2ad0 = ppfVar16;
  pfStack_2ac8 = handle;
  pfStack_2ac0 = pfVar11;
  pfStack_2ab8 = info;
  ppfStack_2ab0 = (fdb_doc **)_Var31._M_i;
  pfStack_2aa8 = pfVar5;
  gettimeofday(&tStack_3200,(__timezone_ptr_t)0x0);
  pfStack_3280 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_3280 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar20 = (fdb_kvs_handle *)auStack_31f0;
  pfStack_3280 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_31f0._8_8_ = (list *)0x0;
  auStack_31f0._16_8_ = (list *)0x400;
  auStack_31f0[0x2f] = '\0';
  if (pfVar17 == (fdb_kvs_handle *)0x0) {
    pfStack_3280 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_3268;
    pfStack_3280 = (fdb_kvs_handle *)0x10f999;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_31f0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_3280 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_3268;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3268,&pfStack_3260,&fStack_3248);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar13 = 0;
      uVar12 = 0;
      do {
        pfStack_3280 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_2ef8,"key%d",uVar12 & 0xffffffff);
        pfStack_3280 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_31f0 + 0x1f8,"meta%d",uVar12 & 0xffffffff);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_31f0 + 0xf8,"body%d",uVar12 & 0xffffffff);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa20;
        pfVar11 = (fdb_kvs_handle *)strlen(acStack_2ef8);
        pfVar5 = (fdb_kvs_handle *)(auStack_31f0 + 0x1f8);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa33;
        sVar6 = strlen((char *)pfVar5);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa43;
        sVar7 = strlen(auStack_31f0 + 0xf8);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_2df8 + lVar13),acStack_2ef8,(size_t)pfVar11,
                       pfVar5,sVar6,auStack_31f0 + 0xf8,sVar7);
        pfStack_3280 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_3260,apfStack_2df8[uVar12]);
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 8;
      } while (uVar12 != 100);
      pfStack_3280 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_3268,'\0');
      pfStack_3280 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_3260,(fdb_kvs_info *)auStack_3230);
      pfVar17 = (fdb_kvs_handle *)(auStack_3230 + 0x10);
      if ((filemgr *)auStack_3230._16_8_ != (filemgr *)0x64) {
        pfStack_3280 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar13 = 0;
      _Var31._M_i = (__int_type_conflict)&pfStack_3258;
      do {
        pfStack_3280 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_3260,apfStack_2df8[lVar13]);
        if (lVar13 == 0x32) {
          pfStack_3280 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var31._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_3268);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 100);
      pfStack_3280 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_3258,&pvStack_3250);
      pfStack_3280 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_3268,'\x01');
      pfStack_3280 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_3260,(fdb_kvs_info *)auStack_3230);
      if ((filemgr *)auStack_3230._16_8_ != (filemgr *)0x0) {
        pfStack_3280 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_3280 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_3260);
      pfVar20 = (fdb_kvs_handle *)&pfStack_3268;
      pfStack_3280 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_3268);
      pfStack_3280 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar20;
      fVar3 = fdb_open((fdb_file_handle **)pfVar20,"./compact_test1",(fdb_config *)auStack_31f0);
      handle = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_3280 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_3268;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3268,&pfStack_3260,&fStack_3248);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_3280 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_3260,(fdb_kvs_info *)auStack_3230);
        if ((filemgr *)auStack_3230._16_8_ != (filemgr *)0x0) {
          pfStack_3280 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar13 = 0;
        do {
          pfStack_3280 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_2df8[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 100);
        pfStack_3280 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_3260);
        pfStack_3280 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_3268);
        pfStack_3280 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_3280 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_3280 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar21,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_3280 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_3280 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_3280 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_3280 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_3280 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_3268;
    pfStack_3280 = (fdb_kvs_handle *)0x10fc41;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_31f0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_3280 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_3268;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_3268,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_3280 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_3268);
      pfStack_3280 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_3280 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar18 = (char *)0x0;
  pfStack_17038 = (fdb_kvs_handle *)0x10fcab;
  pfStack_16ff0 = ptr_fhandle;
  pfStack_32a8 = pfVar17;
  pfStack_32a0 = handle;
  pfStack_3298 = pfVar11;
  pfStack_3290 = pfVar20;
  ppfStack_3288 = (fdb_doc **)_Var31._M_i;
  pfStack_3280 = pfVar5;
  gettimeofday(&tStack_16e88,(__timezone_ptr_t)0x0);
  pfStack_17038 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_17038 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)auStack_16f90;
  pfStack_17038 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_17038 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_16f90._8_8_ = (kvs_ops_stat *)0x0;
  auStack_16f90._16_8_ = (fdb_file_handle *)0x400;
  auStack_16f90._36_4_ = 1;
  auStack_16f90._46_2_ = 0x1e01;
  auStack_16f90._56_8_ = (docio_handle *)0x1;
  auStack_16f90._120_8_ = 0;
  pcVar21 = auStack_17020;
  pfStack_17038 = (fdb_kvs_handle *)0x10fd11;
  fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test",(fdb_config *)pfVar17);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    auStack_16f90._120_8_ = 4;
    pfStack_17038 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_17020,"compact_test",(fdb_config *)auStack_16f90);
    pfVar17 = (fdb_kvs_handle *)(auStack_17020 + 8);
    pfStack_17038 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_17020._0_8_,(fdb_kvs_handle **)pfVar17,&fStack_16fe8);
    pfStack_17038 = (fdb_kvs_handle *)0x10fd69;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17020._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_17038 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar18 = (char *)0x0;
    uVar12 = 0;
    do {
      pfStack_17038 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_16e30,"key%04d",uVar12 & 0xffffffff);
      pfStack_17038 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_16d30,"meta%04d",uVar12 & 0xffffffff);
      pfStack_17038 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_16c30,"body%04d",uVar12 & 0xffffffff);
      pfVar5 = (fdb_kvs_handle *)(&afStack_16b30[0].kvs_config.create_if_missing + (long)pcVar18);
      pfStack_17038 = (fdb_kvs_handle *)0x10fde9;
      sVar6 = strlen((char *)apfStack_16e30);
      _Var31._M_i = sVar6 + 1;
      pfStack_17038 = (fdb_kvs_handle *)0x10fdf5;
      sVar6 = strlen(acStack_16d30);
      pfVar11 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_17038 = (fdb_kvs_handle *)0x10fe01;
      sVar6 = strlen(acStack_16c30);
      pfStack_17038 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar5,apfStack_16e30,_Var31._M_i,acStack_16d30,(size_t)pfVar11,
                     acStack_16c30,sVar6 + 1);
      pfStack_17038 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_17020._8_8_,
              *(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + uVar12 * 8));
      uVar12 = uVar12 + 1;
      pcVar18 = (char *)((long)pcVar18 + 8);
    } while (uVar12 != 10000);
    pfVar17 = (fdb_kvs_handle *)auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_17020._0_8_,'\0');
    pfStack_17038 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_17020._0_8_);
    pfStack_17038 = (fdb_kvs_handle *)0x10fe7d;
    pcVar21 = (char *)pfVar17;
    fVar3 = fdb_open((fdb_file_handle **)pfVar17,"compact_test",(fdb_config *)auStack_16f90);
    handle = (fdb_kvs_handle *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_17038 = (fdb_kvs_handle *)0x10fe99;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17020._0_8_,(fdb_kvs_handle **)(auStack_17020 + 8)
                       ,&fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_17038 = (fdb_kvs_handle *)0x10feb9;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17020._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar17 = (fdb_kvs_handle *)&_Stack_16e78;
    pfStack_17038 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_17020._0_8_,(fdb_file_info *)pfVar17);
    pfStack_17038 = (fdb_kvs_handle *)0x10fee5;
    iVar4 = strcmp((char *)_Stack_16e78._M_i,"compact_test");
    if (iVar4 != 0) {
      pfStack_17038 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar18 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_16e30;
    pfVar11 = (fdb_kvs_handle *)0x0;
    pfVar20 = pfVar5;
    do {
      pfStack_17038 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17038 = (fdb_kvs_handle *)0x10ff20;
      sVar6 = strlen((char *)_Var31._M_i);
      pfStack_17038 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_17008,(void *)_Var31._M_i,sVar6 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17038 = (fdb_kvs_handle *)0x10ff50;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17020._8_8_,(fdb_doc *)pfStack_17008);
      pfVar5 = pfStack_17008;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_17038 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar17 = (fdb_kvs_handle *)(pfStack_17008->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16b30[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17038 = (fdb_kvs_handle *)0x10ff7c;
      iVar4 = bcmp(pfVar17,handle,(size_t)(pfStack_17008->kvs_config).custom_cmp_param);
      pfVar20 = pfVar5;
      if (iVar4 != 0) {
        pfStack_17038 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_17038 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar5);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_17038 = (fdb_kvs_handle *)0x10ffb0;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_17020._8_8_,
                              (fdb_kvs_handle **)&pfStack_16fc8,10000);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_17038 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_16fc8);
    pfVar17 = (fdb_kvs_handle *)auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_17020._0_8_);
    pfStack_17038 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_17038 = (fdb_kvs_handle *)0x10fff2;
    pcVar21 = (char *)pfVar17;
    fVar3 = fdb_open((fdb_file_handle **)pfVar17,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_17038 = (fdb_kvs_handle *)0x11000e;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17020._0_8_,(fdb_kvs_handle **)(auStack_17020 + 8)
                       ,&fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_17038 = (fdb_kvs_handle *)0x11002e;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17020._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar18 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_16e30;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17038 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17038 = (fdb_kvs_handle *)0x110060;
      sVar6 = strlen((char *)_Var31._M_i);
      pfStack_17038 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_17008,(void *)_Var31._M_i,sVar6 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17038 = (fdb_kvs_handle *)0x110090;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17020._8_8_,(fdb_doc *)pfStack_17008);
      pfVar20 = pfStack_17008;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar17 = (fdb_kvs_handle *)(pfStack_17008->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16b30[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17038 = (fdb_kvs_handle *)0x1100bc;
      iVar4 = bcmp(pfVar17,handle,(size_t)(pfStack_17008->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107eb;
      pfStack_17038 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar20);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar5 = pfVar20;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfVar17 = (fdb_kvs_handle *)auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_17020._0_8_);
    pfStack_17038 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_17038 = (fdb_kvs_handle *)0x11010c;
    pcVar21 = (char *)pfVar17;
    fVar3 = fdb_open((fdb_file_handle **)pfVar17,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_17038 = (fdb_kvs_handle *)0x110128;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17020._0_8_,(fdb_kvs_handle **)(auStack_17020 + 8)
                       ,&fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_17038 = (fdb_kvs_handle *)0x110148;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17020._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar18 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_16e30;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17038 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17038 = (fdb_kvs_handle *)0x11017a;
      sVar6 = strlen((char *)_Var31._M_i);
      pfStack_17038 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_17008,(void *)_Var31._M_i,sVar6 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17038 = (fdb_kvs_handle *)0x1101aa;
      pcVar21 = (char *)auStack_17020._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_17020._8_8_,(fdb_doc *)pfStack_17008);
      pfVar20 = pfStack_17008;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar17 = (fdb_kvs_handle *)(pfStack_17008->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16b30[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17038 = (fdb_kvs_handle *)0x1101d6;
      iVar4 = bcmp(pfVar17,handle,(size_t)(pfStack_17008->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107fb;
      pfStack_17038 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar20);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar5 = pfVar20;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_17038 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_17020._0_8_);
    pcVar21 = (char *)&pfStack_16ff8;
    pfStack_17038 = (fdb_kvs_handle *)0x110219;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_less",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_17038 = (fdb_kvs_handle *)0x110238;
    pcVar21 = (char *)pfStack_16ff8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16ff8,(fdb_kvs_handle **)&pfStack_16fb0,
                       &fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff;
    pcVar21 = (char *)&pfStack_17000;
    pfStack_17038 = (fdb_kvs_handle *)0x11025d;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_17038 = (fdb_kvs_handle *)0x110279;
    pcVar21 = (char *)pfStack_17000;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17000,(fdb_kvs_handle **)&aStack_16fb8.seqtree,
                       &fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff00;
    pcVar21 = (char *)&pfStack_17010;
    pfStack_17038 = (fdb_kvs_handle *)0x11029e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_17038 = (fdb_kvs_handle *)0x1102ba;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17010,(fdb_kvs_handle **)&aStack_16fc0.seqtree,
                       &fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_16f90._46_2_ = 0x1e01;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x1102e1;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_17038 = (fdb_kvs_handle *)0x1102fd;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_17020._0_8_,(fdb_kvs_handle **)(auStack_17020 + 8)
                       ,&fStack_16fe8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_17038 = (fdb_kvs_handle *)0x11031d;
    pcVar21 = (char *)auStack_17020._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_17020._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar18 = (char *)0x0;
    pfStack_17038 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_17038 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_16f90 + 0xf8),(__timezone_ptr_t)0x0);
    tVar33.tv_usec = _Stack_16e90._M_i;
    tVar33.tv_sec = auStack_16f90._248_8_;
    do {
      pfVar20 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar11 = (fdb_kvs_handle *)0x0;
      iVar4 = 0;
      aStack_16fd0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar18;
      do {
        pfStack_17038 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_17020._8_8_,*(fdb_doc **)(acStack_32b0 + (long)pfVar20));
        pfStack_17038 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_17020._0_8_,'\0');
        uVar24 = (int)((ulong)pfVar11 / 100) * 100 + iVar4;
        handle = (fdb_kvs_handle *)(ulong)uVar24;
        if (uVar24 == 0) {
          pfStack_17038 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_16fb0,*(fdb_doc **)(acStack_32b0 + (long)pfVar20));
          pfStack_17038 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_16ff8,'\0');
        }
        pfStack_17038 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_16fb8.seqtree,*(fdb_doc **)(acStack_32b0 + (long)pfVar20));
        pfStack_17038 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_17000,'\0');
        pfStack_17038 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_16fc0.seqtree,*(fdb_doc **)(acStack_32b0 + (long)pfVar20));
        pfStack_17038 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_17010,'\0');
        pfStack_17038 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_16fa0,(__timezone_ptr_t)0x0);
        pfStack_17038 = (fdb_kvs_handle *)0x110420;
        tVar32 = _utime_gap(tVar33,tStack_16fa0);
        if (pfStack_16ff0 <= (fdb_kvs_handle *)tVar32.tv_sec) {
          pcVar18 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar4 = iVar4 + -1;
        pfVar11 = (fdb_kvs_handle *)(ulong)((int)pfVar11 + 1);
        pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).custom_cmp;
        pcVar18 = (char *)aStack_16fd0;
      } while (pfVar20 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar18 == 0);
    pfStack_17038 = (fdb_kvs_handle *)0x110459;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_17020._0_8_,0x3c);
    pfVar17 = (fdb_kvs_handle *)auStack_16f90._248_8_;
    _Var31._M_i = _Stack_16e90._M_i;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_17038 = (fdb_kvs_handle *)0x110470;
    pcVar21 = (char *)auStack_17020._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_17020._0_8_,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_17038 = (fdb_kvs_handle *)0x110484;
    pcVar21 = (char *)pfStack_17000;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_17000,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_17038 = (fdb_kvs_handle *)0x11049d;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_17010,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff00;
    pcVar21 = (char *)&pfStack_16fa8;
    pfStack_17038 = (fdb_kvs_handle *)0x1104c5;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_17038 = (fdb_kvs_handle *)0x1104e1;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_17010,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_17038 = (fdb_kvs_handle *)0x1104f7;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16fa8);
    pcVar21 = (char *)pfStack_16fa8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_17038 = (fdb_kvs_handle *)0x110513;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_17010,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_17038 = (fdb_kvs_handle *)0x11052f;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_17010,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_17038 = (fdb_kvs_handle *)0x110541;
    pcVar21 = (char *)pfStack_17010;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17010);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_16f90[0x2e] = 1;
    pcVar21 = (char *)&pfStack_17010;
    pfStack_17038 = (fdb_kvs_handle *)0x110566;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_17038 = (fdb_kvs_handle *)0x11057c;
    pcVar21 = (char *)pfStack_17000;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_17000,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_17038 = (fdb_kvs_handle *)0x11058e;
    pcVar21 = (char *)pfStack_17000;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17000);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff00;
    pcVar21 = (char *)&pfStack_17000;
    pfStack_17038 = (fdb_kvs_handle *)0x1105b3;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar18 = "compact_test_non.manual";
    pfStack_17038 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_17000,"compact_test_non.manual");
    pfVar17 = (fdb_kvs_handle *)auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_17020._0_8_);
    pfStack_17038 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_16ff8);
    pfStack_17038 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_17010);
    auStack_16f90[0x2e] = 1;
    pfStack_17038 = (fdb_kvs_handle *)0x110607;
    pcVar21 = (char *)pfVar17;
    fVar3 = fdb_open((fdb_file_handle **)pfVar17,"compact_test_non.manual",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar21 = "compact_test_non.manual";
    pfStack_17038 = (fdb_kvs_handle *)0x110624;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff00;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x11064a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar21 = "compact_test_manual_compacted";
    pfStack_17038 = (fdb_kvs_handle *)0x110667;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_16f90[0x2e] = 1;
    pcVar21 = "compact_test_manual_compacted";
    pfStack_17038 = (fdb_kvs_handle *)0x110688;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_16f90._46_2_ = auStack_16f90._46_2_ & 0xff00;
    pcVar21 = "compact_test_non.manual";
    pfStack_17038 = (fdb_kvs_handle *)0x1106a8;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_17038 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_17000);
    pfStack_17038 = (fdb_kvs_handle *)0x1106c0;
    fVar3 = fdb_shutdown();
    pcVar21 = (char *)pfStack_17000;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar21 = "compact_test_non.manual";
    pfStack_17038 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_16f90._36_4_ = 2;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x110704;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x110726;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x110748;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_non",(fdb_config *)auStack_16f90);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar21 = auStack_17020;
    pfStack_17038 = (fdb_kvs_handle *)0x11076a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar21,"compact_test_non.manual",
                     (fdb_config *)auStack_16f90);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar13 = 0;
      do {
        pfStack_17038 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_16b30[0].kvs_config.create_if_missing + lVar13 * 8));
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10000);
      pfStack_17038 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_17038 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_17038 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar21,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_17038 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_17038 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_17038 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_17038 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_17038 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_17038 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_17038 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_17038 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar20 = pfVar5;
LAB_00110833:
    pfStack_17038 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_17038 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_17038 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_17038 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_17038 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_17038 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_17038 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_17038 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_17038 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_17038 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_17038 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_17038 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_17038 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_17038 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_17038 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_17038 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_17038 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_17038 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_17038 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_17038 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_17038 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_17038 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_17038 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_17038 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_17038 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_17038 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_17038 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_17038 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_17038 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_17038 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_17038 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_17038 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_17038 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_17038 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_17038 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_17038 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_17038 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_17038 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_17038 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_171d0 = (fdb_kvs_handle *)0x110916;
  aStack_17060 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar18;
  pfStack_17058 = handle;
  pfStack_17050 = pfVar11;
  pfStack_17048 = pfVar17;
  ppfStack_17040 = (fdb_doc **)_Var31._M_i;
  pfStack_17038 = pfVar20;
  gettimeofday(&tStack_17180,(__timezone_ptr_t)0x0);
  pfStack_171d0 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_171d0 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_171d0 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_1712a = 1;
  uStack_17120._0_2_ = 1;
  uStack_17120._2_2_ = 0;
  uStack_17120._4_4_ = 0;
  pfStack_171d0 = (fdb_kvs_handle *)0x110955;
  fVar3 = fdb_open(&pfStack_171c0,"compact_test",(fdb_config *)(auStack_17170 + 0x18));
  pfVar27 = (fdb_config *)(auStack_17170 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar27 = (fdb_config *)auStack_17170;
    pfStack_171d0 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_171d0 = (fdb_kvs_handle *)0x11097c;
    fVar3 = fdb_kvs_open_default(pfStack_171c0,&pfStack_171b8,(fdb_kvs_config *)pfVar27);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_171d0 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_17190,(__timezone_ptr_t)0x0);
    pfStack_171d0 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar21 & 0xffffffff);
    tVar32.tv_usec = tStack_17190.tv_usec;
    tVar32.tv_sec = tStack_17190.tv_sec;
    pfVar11 = (fdb_kvs_handle *)((long)&atStack_171b0[1].tv_sec + 1);
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar20;
      pfStack_171d0 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar11,"%d",pfVar20);
      handle = pfStack_171b8;
      pfStack_171d0 = (fdb_kvs_handle *)0x1109d1;
      sVar6 = strlen((char *)pfVar11);
      pfStack_171d0 = (fdb_kvs_handle *)0x1109ec;
      fVar3 = fdb_set_kv(handle,pfVar11,sVar6,"value",5);
      pfVar27 = (fdb_config *)tStack_17190.tv_sec;
      _Var31._M_i = tStack_17190.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_171d0 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_171d0 = (fdb_kvs_handle *)0x110a00;
      fVar3 = fdb_commit(pfStack_171c0,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_171d0 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_171d0 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_171b0,(__timezone_ptr_t)0x0);
      pfStack_171d0 = (fdb_kvs_handle *)0x110a29;
      tVar33 = _utime_gap(tVar32,atStack_171b0[0]);
    } while (((fdb_kvs_handle *)tVar33.tv_sec < pcVar21) &&
            (pfVar20 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_171d0 = (fdb_kvs_handle *)0x110a49;
    fVar3 = fdb_close(pfStack_171c0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_171d0 = (fdb_kvs_handle *)0x110a52;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_171d0 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_171d0 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar21,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_171d0 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_171d0 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_171d0 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_171d0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_171f8 = (fdb_kvs_handle *)pcVar21;
  pfStack_171f0 = handle;
  pfStack_171e8 = pfVar11;
  pfStack_171e0 = pfVar27;
  ppfStack_171d8 = (fdb_doc **)_Var31._M_i;
  pfStack_171d0 = pfVar20;
  gettimeofday(&tStack_17500,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17570._32_8_ = (btree *)0x0;
  auStack_17570._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_172f0.wal_threshold = 0x1000;
  fStack_172f0.compaction_mode = '\x01';
  fStack_172f0.compaction_threshold = '\n';
  fStack_172f0.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar5 = (fdb_kvs_handle *)&pfStack_17590;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar5,"compact_test",&fStack_172f0,1,
                              (char **)(auStack_17570 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17570 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17570._16_8_ = afStack_174f0[0].doc_count;
    auStack_17570._0_8_ = afStack_174f0[0].filename;
    auStack_17570._8_8_ = afStack_174f0[0].new_filename;
    info_00 = (fdb_file_info *)auStack_17588;
    pfVar5 = pfStack_17590;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17590,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_17570);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_17578;
    kvs_config_00 = (fdb_file_info *)auStack_17570;
    pfVar5 = pfStack_17590;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17590,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar12 = 0;
    do {
      sprintf((char *)afStack_174f0,"key%06d",uVar12);
      sprintf((char *)afStack_173f0,"body%06d",uVar12);
      pfVar5 = (fdb_kvs_handle *)auStack_17588._0_8_;
      sVar6 = strlen((char *)afStack_174f0);
      sVar7 = strlen((char *)afStack_173f0);
      kvs_config_00 = afStack_173f0;
      info_00 = afStack_174f0;
      fVar3 = fdb_set_kv(pfVar5,afStack_174f0,sVar6,afStack_173f0,sVar7);
      handle_00 = auStack_17578;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar6 = strlen((char *)afStack_174f0);
      sVar7 = strlen((char *)afStack_173f0);
      kvs_config_00 = afStack_173f0;
      info_00 = afStack_174f0;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_174f0,sVar6,afStack_173f0,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar5 = (fdb_kvs_handle *)handle_00;
        goto LAB_00110e9b;
      }
      uVar24 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar24;
    } while (uVar24 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_17570;
    auStack_17570._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_17588 + 8);
    pfVar5 = pfStack_17590;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17590,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_174f0;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_173f0;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar6 = strlen((char *)info_00);
    sVar7 = strlen((char *)kvs_config_00);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17588._8_8_,info_00,sVar6,kvs_config_00,sVar7);
    pfVar5 = (fdb_kvs_handle *)auStack_17588._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar5 = pfStack_17590;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17590,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar12 = 0;
    uVar28 = 0;
    do {
      sprintf((char *)afStack_174f0,"key%06d",uVar28);
      sprintf((char *)afStack_173f0,"body%06d",uVar28);
      pfVar5 = (fdb_kvs_handle *)auStack_17588._0_8_;
      sVar6 = strlen((char *)afStack_174f0);
      sVar7 = strlen((char *)afStack_173f0);
      kvs_config_00 = afStack_173f0;
      info_00 = afStack_174f0;
      fVar3 = fdb_set_kv(pfVar5,afStack_174f0,sVar6,afStack_173f0,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_17570 + 0x28);
      pfVar5 = pfStack_17590;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17590,info_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar12 < uStack_17520) {
        uVar12 = uStack_17520;
      }
      uVar24 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar24;
    } while (uVar24 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar5 = pfStack_17590;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17590,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_17570 + 0x28);
    pfVar5 = pfStack_17590;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17590,info_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar12 < uStack_17520) {
      uVar12 = uStack_17520;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar12);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_17570 + 0x28);
      pfVar5 = pfStack_17590;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17590,
                                (fdb_file_info *)(auStack_17570 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar12 <= uStack_17520);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17590);
    pfVar5 = pfStack_17590;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar5 = pfStack_17590;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar21,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(pfVar5,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(pfVar5,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void compact_reopen_with_iterator()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 9;
    int count = 0;
    int nkvdocs;
    fdb_file_handle *dbfile, *compact_file;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_kvs_info kvs_info;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_with_iterator");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // MB-13859: compact the file using a separate handle..
    fdb_open(&compact_file, "./compact_test1", &fconfig);
    // compact
    status = fdb_compact(compact_file, "./compact_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close file after compaction to make the new_file's ref count 0
    fdb_close(compact_file);

    i = 0;
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n);


    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test2", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen with iterator");
}